

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_tables.c
# Opt level: O1

void add_struct_str_member_fn(File *fp,char **dest,char *str)

{
  uint uVar1;
  char *pcVar2;
  char **ppcVar3;
  size_t sVar4;
  
  if (fp->binary == 0) {
    if (fp->first_member == 0) {
      myfprintf(fp->fp,", ");
    }
    myfprintf(fp->fp,"\"%s\"",str);
    goto LAB_0013a679;
  }
  sVar4 = strlen(str);
  make_room_in_buf(&fp->strings,sVar4 + 1);
  pcVar2 = (fp->strings).cur;
  strcpy(pcVar2,str);
  ppcVar3 = &(fp->strings).cur;
  *ppcVar3 = *ppcVar3 + sVar4 + 1;
  *dest = pcVar2 + -(long)(fp->strings).start;
  ppcVar3 = (fp->str_relocations).v;
  if (ppcVar3 == (char **)0x0) {
    pcVar2 = (fp->tables).start;
    (fp->str_relocations).v = (fp->str_relocations).e;
    uVar1 = (fp->str_relocations).n;
    (fp->str_relocations).n = uVar1 + 1;
    (fp->str_relocations).e[uVar1] = (char *)((long)dest - (long)pcVar2);
    goto LAB_0013a679;
  }
  uVar1 = (fp->str_relocations).n;
  if (ppcVar3 == (fp->str_relocations).e) {
    if (2 < uVar1) goto LAB_0013a666;
    pcVar2 = (fp->tables).start;
  }
  else {
    if ((uVar1 & 7) == 0) {
LAB_0013a666:
      vec_add_internal(&fp->str_relocations,(void *)((long)dest - (long)(fp->tables).start));
      goto LAB_0013a679;
    }
    pcVar2 = (fp->tables).start;
  }
  (fp->str_relocations).n = uVar1 + 1;
  ppcVar3[uVar1] = (char *)((long)dest - (long)pcVar2);
LAB_0013a679:
  fp->first_member = 0;
  return;
}

Assistant:

static void add_struct_str_member_fn(File *fp, char **dest, const char *str) {
  if (fp->binary) {
    *dest = (char *)make_string(fp, str);
    vec_add(&fp->str_relocations, (void *)((char *)dest - fp->tables.start));
  } else {
    if (!fp->first_member) fprintf(fp->fp, ", ");
    fprintf(fp->fp, "\"%s\"", str);
  }
  fp->first_member = 0;
}